

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O3

int KINSol(void *kinmem,N_Vector u,int strategy_in,N_Vector u_scale,N_Vector f_scale)

{
  N_Vector p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  N_Vector x;
  undefined4 in_register_00000014;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *module;
  char *module_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *module_01;
  char *extraout_RDX_04;
  char *module_02;
  char *module_03;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *module_04;
  char *module_05;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *module_06;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *module_07;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *module_08;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *module_09;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *module_10;
  char *extraout_RDX_24;
  char *extraout_RDX_25;
  char *module_11;
  char *extraout_RDX_26;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *extraout_RDX_29;
  char *module_12;
  char *module_13;
  char *extraout_RDX_30;
  KINMem pKVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  N_Vector p_Var15;
  bool bVar16;
  undefined8 uVar17;
  sunrealtype sVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  double dVar28;
  double dVar29;
  sunrealtype *R;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  undefined1 local_c8 [16];
  double local_b8;
  undefined8 local_a8;
  double local_98;
  
  if (kinmem == (void *)0x0) {
    pcVar10 = "KINSol";
    pcVar12 = "kinsol_mem = NULL illegal.";
    uVar9 = 0xffffffff;
    kinmem = (KINMem)0x0;
    iVar7 = -1;
    iVar6 = 0x1f0;
  }
  else if (*(int *)((long)kinmem + 0x298) == 0) {
    pcVar10 = "KINSol";
    pcVar12 = "Attempt to call before KINMalloc illegal.";
    uVar9 = 0xfffffffd;
    iVar7 = -3;
    iVar6 = 0x1f9;
  }
  else {
    *(N_Vector *)((long)kinmem + 0x108) = u;
    *(N_Vector *)((long)kinmem + 0x128) = u_scale;
    *(N_Vector *)((long)kinmem + 0x130) = f_scale;
    *(int *)((long)kinmem + 0x30) = strategy_in;
    if (strategy_in == 3) {
      if (u == (N_Vector)0x0) {
        pcVar10 = "KINSol";
        pcVar12 = "uu = NULL illegal.";
        uVar9 = 0xfffffffe;
        iVar7 = -2;
        iVar6 = 0x20d;
      }
      else if (*(int *)((long)kinmem + 0x60) == 0) {
        KINPrintInfo((KINMem)kinmem,3,(char *)CONCAT44(in_register_00000014,strategy_in),
                     (char *)u_scale,"scsteptol = %12.3lg  fnormtol = %12.3lg",
                     *(undefined8 *)((long)kinmem + 0x28),*(undefined8 *)((long)kinmem + 0x20));
        *(undefined8 *)((long)kinmem + 0xe8) = 0;
        *(undefined8 *)((long)kinmem + 0xf0) = 0;
        *(undefined8 *)((long)kinmem + 0xd8) = 0;
        *(undefined8 *)((long)kinmem + 0xe0) = 0;
        *(undefined8 *)((long)kinmem + 0xf8) = 0;
        p_Var1 = *(N_Vector *)((long)kinmem + 0x148);
        *(undefined8 *)((long)kinmem + 0xd0) = 1;
        pKVar11 = *(KINMem *)((long)kinmem + 0x108);
        iVar6 = (**(code **)((long)kinmem + 0x10))
                          (pKVar11,*(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x18));
        *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
        pcVar10 = extraout_RDX_00;
        while (-1 < iVar6) {
          if (*(long *)((long)kinmem + 0x1c0) == 0) {
LAB_0010a01e:
            if (*(int *)((long)kinmem + 0x164) == 0) {
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x110));
              dVar23 = 1.0;
            }
            else {
              N_VLinearSum(1.0 - *(double *)((long)kinmem + 0x168),
                           *(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x110));
LAB_0010a05d:
              dVar23 = *(double *)((long)kinmem + 0x168);
            }
          }
          else {
            lVar8 = *(long *)((long)kinmem + 0xd0);
            uVar14 = *(ulong *)((long)kinmem + 0x1c8);
            if (lVar8 <= (long)uVar14) goto LAB_0010a01e;
            if ((long)uVar14 < 1) {
              uVar14 = 0;
            }
            u_scale = *(N_Vector *)((long)kinmem + 0x110);
            AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),p_Var1,u_scale,
                        *(N_Vector *)((long)kinmem + 0x108),lVar8 + ~uVar14,
                        *(sunrealtype **)((long)kinmem + 0x1a8),
                        *(sunrealtype **)((long)kinmem + 0x1a0));
            dVar23 = 1.0;
            if ((~uVar14 + lVar8 == 0) && (dVar23 = 1.0, *(int *)((long)kinmem + 0x1e8) != 0))
            goto LAB_0010a05d;
          }
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
                       *(undefined8 *)((long)kinmem + 0x108),p_Var1);
          N_VProd(*(undefined8 *)((long)kinmem + 0x130),p_Var1,*(undefined8 *)((long)kinmem + 0x148)
                 );
          pKVar11 = *(KINMem *)((long)kinmem + 0x148);
          uVar17 = N_VMaxNorm();
          *(undefined8 *)((long)kinmem + 0x250) = uVar17;
          KINPrintInfo(pKVar11,4,module,(char *)u_scale,"scaled f norm (for stopping) = %12.3lg");
          uVar17 = *(undefined8 *)((long)kinmem + 0xd8);
          KINPrintInfo(pKVar11,2,module_00,(char *)u_scale,
                       "nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
                       *(undefined8 *)((long)kinmem + 0x250),*(undefined8 *)((long)kinmem + 0xd0),
                       uVar17);
          u_scale = *(N_Vector *)((long)kinmem + 0xd0);
          dVar23 = dVar23 * *(double *)((long)kinmem + 0x20);
          if ((*(double *)((long)kinmem + 0x250) <= dVar23) ||
             (*(long *)((long)kinmem + 0x38) <= (long)u_scale)) {
            pcVar10 = (char *)0xfffffffa;
            if ((long)u_scale < *(long *)((long)kinmem + 0x38)) {
              pcVar10 = (char *)0xfffffc19;
            }
            pcVar12 = (char *)0x0;
            if (dVar23 < *(double *)((long)kinmem + 0x250)) {
              pcVar12 = pcVar10;
            }
            iVar6 = (int)pcVar12;
            module_01 = extraout_RDX_01;
            if (*(int *)((long)kinmem + 0x160) != 0) {
              pKVar11 = *(KINMem *)((long)kinmem + 0x110);
              N_VScale(0x3ff0000000000000,pKVar11,*(undefined8 *)((long)kinmem + 0x108));
              module_01 = extraout_RDX_03;
            }
            KINPrintInfo(pKVar11,1,module_01,pcVar10,"Return value: %d",pcVar12,uVar17);
            if (iVar6 != -6) {
              if (iVar6 != -0xd) {
                return iVar6;
              }
              goto LAB_0010a1a4;
            }
            pcVar10 = "KINSol";
            pcVar12 = "The maximum number of iterations was reached before convergence.";
            uVar9 = 0xfffffffa;
            iVar7 = -6;
            iVar6 = 0x22b;
            goto LAB_0010a311;
          }
          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
                   *(undefined8 *)((long)kinmem + 0x108));
          *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
          pKVar11 = *(KINMem *)((long)kinmem + 0x108);
          iVar6 = (**(code **)((long)kinmem + 0x10))
                            (pKVar11,*(undefined8 *)((long)kinmem + 0x118),
                             *(undefined8 *)((long)kinmem + 0x18));
          *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
          pcVar10 = extraout_RDX_02;
        }
        KINPrintInfo(pKVar11,1,pcVar10,(char *)u_scale,"Return value: %d",0xfffffff3);
LAB_0010a1a4:
        pcVar10 = "KINSol";
        pcVar12 = "The system function failed in an unrecoverable manner.";
        uVar9 = 0xfffffff3;
        iVar7 = -0xd;
        iVar6 = 0x227;
      }
      else {
        pcVar10 = "KINSol";
        pcVar12 = "Constraints not allowed with fixed point or Picard iterations";
        uVar9 = 0xfffffffe;
        iVar7 = -2;
        iVar6 = 0x215;
      }
    }
    else if (u == (N_Vector)0x0) {
      pcVar10 = "KINSolInit";
      pcVar12 = "uu = NULL illegal.";
      uVar9 = 0xfffffffe;
      iVar7 = -2;
      iVar6 = 0x59d;
    }
    else if ((uint)strategy_in < 4) {
      if (u_scale == (N_Vector)0x0) {
        pcVar10 = "KINSolInit";
        pcVar12 = "uscale = NULL illegal.";
        uVar9 = 0xfffffffe;
        iVar7 = -2;
        iVar6 = 0x5b0;
      }
      else {
        dVar23 = (double)N_VMin(u_scale);
        if (dVar23 <= 0.0) {
          pcVar10 = "KINSolInit";
          pcVar12 = "uscale has nonpositive elements.";
          uVar9 = 0xfffffffe;
          iVar7 = -2;
          iVar6 = 0x5b7;
        }
        else if (*(long *)((long)kinmem + 0x130) == 0) {
          pcVar10 = "KINSolInit";
          pcVar12 = "fscale = NULL illegal.";
          uVar9 = 0xfffffffe;
          iVar7 = -2;
          iVar6 = 0x5be;
        }
        else {
          dVar23 = (double)N_VMin();
          if (dVar23 <= 0.0) {
            pcVar10 = "KINSolInit";
            pcVar12 = "fscale has nonpositive elements.";
            uVar9 = 0xfffffffe;
            iVar7 = -2;
            iVar6 = 0x5c5;
          }
          else {
            pKVar11 = *(KINMem *)((long)kinmem + 0x140);
            if (pKVar11 == (KINMem)0x0) {
              *(undefined4 *)((long)kinmem + 0x60) = 0;
              pcVar10 = extraout_RDX;
LAB_0010a334:
              KINPrintInfo(pKVar11,3,pcVar10,(char *)u_scale,
                           "scsteptol = %12.3lg  fnormtol = %12.3lg",
                           *(undefined8 *)((long)kinmem + 0x28));
              dVar23 = *(double *)((long)kinmem + 0x80);
              if ((dVar23 == 0.0) && (!NAN(dVar23))) {
                dVar23 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x108),
                                            *(undefined8 *)((long)kinmem + 0x128));
                dVar23 = dVar23 * 1000.0;
              }
              dVar19 = 1.0;
              if (1.0 <= dVar23) {
                dVar19 = dVar23;
              }
              *(double *)((long)kinmem + 0x78) = dVar19;
              if (*(int *)((long)kinmem + 0x240) == 0) {
                *(undefined4 *)((long)kinmem + 0x68) = 0;
              }
              else {
                bVar16 = *(int *)((long)kinmem + 0x58) != 3;
                u_scale = (N_Vector)(ulong)bVar16;
                *(uint *)((long)kinmem + 0x68) = (uint)bVar16;
                if (bVar16) {
                  if (*(int *)((long)kinmem + 0x58) == 1) {
                    *(undefined8 *)((long)kinmem + 0xb8) = 0x3ff9e3779b97f4a8;
                  }
                  *(undefined8 *)((long)kinmem + 0xa8) = 0x3fe0000000000000;
                }
                *(undefined4 *)((long)kinmem + 0x6c) = 1;
              }
              *(undefined8 *)((long)kinmem + 0xf0) = 0;
              *(undefined8 *)((long)kinmem + 0xf8) = 0;
              *(undefined8 *)((long)kinmem + 0xe0) = 0;
              *(undefined8 *)((long)kinmem + 0xe8) = 0;
              *(undefined8 *)((long)kinmem + 0xd0) = 0;
              *(undefined8 *)((long)kinmem + 0xd8) = 0;
              iVar6 = (**(code **)((long)kinmem + 0x10))
                                (*(undefined8 *)((long)kinmem + 0x108),
                                 *(undefined8 *)((long)kinmem + 0x118),
                                 *(undefined8 *)((long)kinmem + 0x18));
              *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
              if (iVar6 < 0) {
                pcVar10 = "KINSolInit";
                pcVar12 = "The system function failed in an unrecoverable manner.";
                uVar9 = 0xfffffff3;
                iVar7 = -0xd;
                iVar6 = 0x629;
              }
              else if (iVar6 == 0) {
                pKVar11 = (KINMem)kinmem;
                sVar18 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                                    *(N_Vector *)((long)kinmem + 0x130));
                if (sVar18 <= *(double *)((long)kinmem + 0x20) * 0.01) {
                  uVar17 = N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                      *(undefined8 *)((long)kinmem + 0x130));
                  *(undefined8 *)((long)kinmem + 0x250) = uVar17;
                  return 1;
                }
                KINPrintInfo(pKVar11,4,module_02,(char *)u_scale,
                             "scaled f norm (for stopping) = %12.3lg");
                if ((*(code **)((long)kinmem + 0x220) == (code *)0x0) ||
                   (iVar6 = (**(code **)((long)kinmem + 0x220))(kinmem), iVar6 == 0)) {
                  pKVar11 = *(KINMem *)((long)kinmem + 0x118);
                  dVar23 = (double)N_VWL2Norm(pKVar11,*(undefined8 *)((long)kinmem + 0x130));
                  *(double *)((long)kinmem + 0x250) = dVar23;
                  *(double *)((long)kinmem + 600) = dVar23 * 0.5 * dVar23;
                  *(double *)((long)kinmem + 0x270) = dVar23;
                  R = *(sunrealtype **)((long)kinmem + 0xd8);
                  KINPrintInfo(pKVar11,2,module_03,(char *)u_scale,
                               "nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
                               *(undefined8 *)((long)kinmem + 0xd0),R);
                  *(undefined8 *)((long)kinmem + 0x100) = 0;
                  *(undefined8 *)((long)kinmem + 200) =
                       *(undefined8 *)
                        (&DAT_0011a0c0 + (ulong)(*(int *)((long)kinmem + 0xc0) == 0) * 8);
                  iVar6 = *(int *)((long)kinmem + 0x240);
                  dVar23 = 0.0;
                  if ((iVar6 != 0) && (*(int *)((long)kinmem + 0x5c) == 0)) {
                    dVar23 = *(double *)((long)kinmem + 0x20) * 0.01;
                  }
                  uVar9 = -(uint)(*(double *)((long)kinmem + 0x280) == 0.0) & 1;
                  pcVar10 = (char *)(ulong)uVar9;
                  *(uint *)((long)kinmem + 0x278) = uVar9;
                  if (*(int *)((long)kinmem + 0x30) != 2) {
                    bVar16 = false;
                    local_e8 = -1.0;
                    local_c8._8_8_ = local_c8._0_8_;
                    local_c8._0_8_ = 0xbff0000000000000;
                    uVar13 = 0;
LAB_0010aa8f:
                    *(undefined4 *)((long)kinmem + 0x70) = 0;
                    *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
                    if (*(int *)((long)kinmem + 0x240) != 0) {
                      dVar19 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8)) *
                               *(double *)((long)kinmem + 0x250);
                      *(double *)((long)kinmem + 0xa0) = dVar19;
                      if (*(int *)((long)kinmem + 0x5c) == 0) {
                        dVar29 = dVar23;
                        if (dVar23 <= dVar19) {
                          dVar29 = dVar19;
                        }
                        *(double *)((long)kinmem + 0xa0) = dVar29;
                      }
                    }
LAB_0010aade:
                    pKVar11 = (KINMem)kinmem;
                    if (*(int *)((long)kinmem + 0x30) == 1) {
                      uVar9 = KINLinSolDrv((KINMem)kinmem);
                      pcVar12 = extraout_RDX_14;
                      if (uVar9 == 0) {
                        local_f0 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x138),
                                                      *(undefined8 *)((long)kinmem + 0x128));
                        dVar19 = *(double *)((long)kinmem + 0x78) / local_f0;
                        *(double *)((long)kinmem + 0x90) = local_f0;
                        if (local_f0 <= *(double *)((long)kinmem + 0x78)) {
                          local_b8 = 1.0;
                          local_e0 = dVar19;
                        }
                        else {
                          N_VScale(dVar19,*(undefined8 *)((long)kinmem + 0x138),
                                   *(undefined8 *)((long)kinmem + 0x138));
                          local_f0 = *(double *)((long)kinmem + 0x78);
                          *(double *)((long)kinmem + 0x90) = local_f0;
                          local_e0 = 1.0;
                          local_b8 = dVar19;
                        }
                        *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
                        if ((*(int *)((long)kinmem + 0x60) == 0) ||
                           (iVar6 = KINConstraint((KINMem)kinmem), iVar6 != -0x3e4)) {
LAB_0010adff:
                          iVar6 = 5;
                          while( true ) {
                            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                         *(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar11 = *(KINMem *)((long)kinmem + 0x110);
                            iVar7 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar11,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            if (iVar7 == 0) break;
                            pcVar12 = extraout_RDX_15;
                            if (iVar7 < 0) goto LAB_0010bbaf;
                            pKVar11 = *(KINMem *)((long)kinmem + 0x138);
                            N_VScale(0x3fe0000000000000,pKVar11,pKVar11);
                            local_b8 = local_b8 * 0.5;
                            local_f0 = local_f0 * 0.5;
                            *(double *)((long)kinmem + 0x90) = local_f0;
                            local_e0 = 1.0;
                            iVar6 = iVar6 + -1;
                            pcVar12 = extraout_RDX_16;
                            if (iVar6 == 0) goto LAB_0010bbf5;
                          }
                          local_e8 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                                        *(undefined8 *)((long)kinmem + 0x130));
                          dVar20 = *(double *)((long)kinmem + 0x260) * local_b8;
                          pKVar11 = (KINMem)kinmem;
                          sVar18 = KINScSNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x138),
                                              *(N_Vector *)((long)kinmem + 0x108));
                          dVar19 = *(double *)((long)kinmem + 0x28) / sVar18;
                          KINPrintInfo(pKVar11,8,module_08,pcVar10,
                                       "min_lam = %11.4le   f1norm = %11.4le   pnorm = %11.4le",
                                       dVar19,*(undefined8 *)((long)kinmem + 600),SUB84(local_f0,0))
                          ;
                          uVar26 = 0;
                          uVar27 = 0;
                          dVar22 = dVar20 * 0.0001;
                          iVar6 = 0;
                          local_98 = 0.0;
                          local_a8 = 0.0;
                          bVar16 = false;
                          pcVar12 = extraout_RDX_17;
                          dVar29 = 1.0;
                          local_c8._0_8_ = local_e8 * 0.5 * local_e8;
                          do {
                            dVar25 = (double)local_c8._0_8_;
                            local_d8 = dVar29;
                            local_c8._8_4_ = uVar26;
                            local_c8._0_8_ = dVar25;
                            local_c8._12_4_ = uVar27;
                            dVar21 = dVar22 * local_d8 + *(double *)((long)kinmem + 600);
                            KINPrintInfo(pKVar11,9,pcVar12,pcVar10,
                                         "fnorm = %15.8le   f1norm = %15.8le   alpha_cond = %15.8le  lam = %15.8le"
                                        );
                            dVar29 = *(double *)((long)kinmem + 600);
                            if (dVar25 <= dVar21) {
                              dVar20 = dVar20 * 0.9;
                              pcVar12 = extraout_RDX_18;
                              if (dVar20 * local_d8 + dVar29 <= dVar25) goto LAB_0010b810;
                              if ((local_d8 != 1.0) || (NAN(local_d8))) goto LAB_0010b59a;
                              if (local_f0 < *(double *)((long)kinmem + 0x78)) {
                                local_a8 = 1.0;
                                goto LAB_0010b44f;
                              }
                              local_d8 = 1.0;
                              goto LAB_0010b82c;
                            }
                            if (bVar16) {
                              dVar24 = (dVar25 - dVar29) - local_d8 * dVar20;
                              dVar29 = (local_a8 - dVar29) - local_98 * dVar20;
                              dVar28 = 1.0 / (local_d8 - local_98);
                              dVar21 = ((1.0 / (local_d8 * local_d8)) * dVar24 +
                                       (-1.0 / (local_98 * local_98)) * dVar29) * dVar28;
                              dVar28 = dVar28 * ((local_d8 / (local_98 * local_98)) * dVar29 -
                                                (local_98 / (local_d8 * local_d8)) * dVar24);
                              dVar29 = dVar21 * 3.0;
                              if (*(double *)((long)kinmem + 8) <= ABS(dVar21)) {
                                dVar24 = dVar28 * dVar28 - dVar20 * dVar29;
                                dVar21 = 0.0;
                                if (0.0 < dVar24) {
                                  if (dVar24 < 0.0) {
                                    dVar21 = sqrt(dVar24);
                                  }
                                  else {
                                    dVar21 = SQRT(dVar24);
                                  }
                                }
                                dVar29 = (dVar21 - dVar28) / dVar29;
                              }
                              else {
                                dVar29 = -dVar20 / (dVar28 + dVar28);
                              }
                            }
                            else {
                              dVar29 = (dVar25 - dVar29) - dVar20;
                              dVar29 = -dVar20 / (dVar29 + dVar29);
                            }
                            dVar21 = local_d8 * 0.5;
                            if (dVar29 <= local_d8 * 0.5) {
                              dVar21 = dVar29;
                            }
                            dVar29 = local_d8 * 0.1;
                            if (local_d8 * 0.1 <= dVar21) {
                              dVar29 = dVar21;
                            }
                            N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar11 = *(KINMem *)((long)kinmem + 0x110);
                            iVar7 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar11,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            pcVar12 = extraout_RDX_19;
                            if (iVar7 != 0) goto LAB_0010bbaf;
                            iVar6 = iVar6 + 1;
                            pKVar11 = *(KINMem *)((long)kinmem + 0x118);
                            local_e8 = (double)N_VWL2Norm(pKVar11,*(undefined8 *)
                                                                   ((long)kinmem + 0x130));
                            uVar26 = (undefined4)extraout_XMM0_Qb;
                            uVar27 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
                            local_c8._0_8_ = local_e8 * 0.5 * local_e8;
                            bVar16 = true;
                            pcVar12 = extraout_RDX_20;
                            local_a8 = dVar25;
                            local_98 = local_d8;
                          } while (dVar19 <= dVar29);
                          pKVar11 = *(KINMem *)((long)kinmem + 0x108);
                          N_VScale(0x3ff0000000000000,pKVar11,*(undefined8 *)((long)kinmem + 0x110))
                          ;
                          pcVar12 = extraout_RDX_21;
                        }
                        else {
                          pKVar11 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(*(undefined8 *)((long)kinmem + 0x98),pKVar11,pKVar11);
                          dVar19 = *(double *)((long)kinmem + 0x98);
                          local_f0 = local_f0 * dVar19;
                          *(double *)((long)kinmem + 0x90) = local_f0;
                          KINPrintInfo(pKVar11,6,module_07,pcVar10,"(ivio=1) pnorm = %12.4le");
                          if (*(double *)((long)kinmem + 0x28) < local_f0) {
                            local_b8 = local_b8 * dVar19;
                            local_e0 = 1.0;
                            goto LAB_0010adff;
                          }
                          pKVar11 = *(KINMem *)((long)kinmem + 0x108);
                          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,pKVar11,
                                       *(undefined8 *)((long)kinmem + 0x138),
                                       *(undefined8 *)((long)kinmem + 0x110));
                          pcVar12 = extraout_RDX_22;
                        }
                        iVar6 = -0x3e5;
                        goto LAB_0010b348;
                      }
                    }
                    else {
                      if (*(int *)((long)kinmem + 0x30) != 0) {
LAB_0010b364:
                        iVar6 = 0;
                        goto LAB_0010b367;
                      }
                      uVar9 = KINLinSolDrv((KINMem)kinmem);
                      pcVar12 = extraout_RDX_09;
                      if (uVar9 == 0) {
                        pKVar11 = *(KINMem *)((long)kinmem + 0x138);
                        local_f0 = (double)N_VWL2Norm(pKVar11,*(undefined8 *)((long)kinmem + 0x128))
                        ;
                        local_b8 = 1.0;
                        pcVar12 = extraout_RDX_10;
                        if (*(double *)((long)kinmem + 0x78) < local_f0) {
                          local_b8 = *(double *)((long)kinmem + 0x78) / local_f0;
                          pKVar11 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(pKVar11,pKVar11);
                          local_f0 = *(double *)((long)kinmem + 0x78);
                          pcVar12 = extraout_RDX_11;
                        }
                        KINPrintInfo(pKVar11,5,pcVar12,pcVar10,"pnorm = %12.4le",local_f0);
                        *(double *)((long)kinmem + 0x90) = local_f0;
                        *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
                        if ((*(int *)((long)kinmem + 0x60) == 0) ||
                           (iVar6 = KINConstraint((KINMem)kinmem), iVar6 != -0x3e4)) {
LAB_0010ac18:
                          iVar6 = 5;
                          while( true ) {
                            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                         *(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar11 = *(KINMem *)((long)kinmem + 0x110);
                            iVar7 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar11,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            if (iVar7 == 0) break;
                            pcVar12 = extraout_RDX_12;
                            if (iVar7 < 0) goto LAB_0010bbaf;
                            local_b8 = local_b8 * 0.5;
                            pKVar11 = *(KINMem *)((long)kinmem + 0x138);
                            N_VScale(0x3fe0000000000000,pKVar11,pKVar11);
                            local_f0 = local_f0 * 0.5;
                            *(double *)((long)kinmem + 0x90) = local_f0;
                            iVar6 = iVar6 + -1;
                            pcVar12 = extraout_RDX_13;
                            if (iVar6 == 0) goto LAB_0010bbf5;
                          }
                          pKVar11 = *(KINMem *)((long)kinmem + 0x118);
                          local_e8 = (double)N_VWL2Norm(pKVar11,*(undefined8 *)
                                                                 ((long)kinmem + 0x130));
                          local_c8._0_8_ = local_e8 * 0.5 * local_e8;
                          dVar19 = local_b8 * *(double *)((long)kinmem + 0x268);
                          auVar5._8_4_ = SUB84(dVar19,0);
                          auVar5._0_8_ = local_b8 * *(double *)((long)kinmem + 0x260);
                          auVar5._12_4_ = (int)((ulong)dVar19 >> 0x20);
                          *(undefined1 (*) [16])((long)kinmem + 0x260) = auVar5;
                          KINPrintInfo(pKVar11,7,module_09,pcVar10,"fnorm(L2) = %20.8le");
                          uVar13 = 0;
                          if (local_f0 <= *(double *)((long)kinmem + 0x78) * 0.99) {
                            bVar16 = false;
                          }
                          else {
                            bVar16 = true;
                            uVar13 = 0;
                          }
                          goto LAB_0010b364;
                        }
                        dVar19 = *(double *)((long)kinmem + 0x98);
                        pKVar11 = *(KINMem *)((long)kinmem + 0x138);
                        N_VScale(pKVar11,pKVar11);
                        local_f0 = local_f0 * *(double *)((long)kinmem + 0x98);
                        *(double *)((long)kinmem + 0x90) = local_f0;
                        KINPrintInfo(pKVar11,5,module_06,pcVar10,"pnorm = %12.4le");
                        if (*(double *)((long)kinmem + 0x28) < local_f0) {
                          local_b8 = local_b8 * dVar19;
                          goto LAB_0010ac18;
                        }
                        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                     *(undefined8 *)((long)kinmem + 0x108),
                                     *(undefined8 *)((long)kinmem + 0x138),
                                     *(undefined8 *)((long)kinmem + 0x110));
                        iVar6 = -0x3e5;
                        bVar16 = false;
                        goto LAB_0010b35c;
                      }
                    }
                    goto LAB_0010bca9;
                  }
                  if (*(long *)((long)kinmem + 0x120) != 0) {
LAB_0010a6d8:
                    local_c8._0_8_ = 0.0;
                    if ((iVar6 != 0) && (*(int *)((long)kinmem + 0x5c) == 0)) {
                      local_c8._0_8_ = *(double *)((long)kinmem + 0x20) * 0.01;
                    }
                    p_Var1 = *(N_Vector *)((long)kinmem + 0x148);
                    lVar8 = 0;
                    do {
                      *(long *)((long)kinmem + 0xd0) = lVar8 + 1;
                      if (iVar6 != 0) {
                        dVar23 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8))
                                 * *(double *)((long)kinmem + 0x250);
                        *(double *)((long)kinmem + 0xa0) = dVar23;
                        if (*(int *)((long)kinmem + 0x5c) == 0) {
                          dVar19 = (double)local_c8._0_8_;
                          if ((double)local_c8._0_8_ <= dVar23) {
                            dVar19 = dVar23;
                          }
                          *(double *)((long)kinmem + 0xa0) = dVar19;
                        }
                      }
                      uVar17 = *(undefined8 *)((long)kinmem + 0x120);
                      uVar2 = *(undefined8 *)((long)kinmem + 0x108);
                      uVar3 = *(undefined8 *)((long)kinmem + 0x118);
                      if (*(long *)((long)kinmem + 0x40) <=
                          (lVar8 + 1) - *(long *)((long)kinmem + 0xe0)) {
                        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
                        *(undefined4 *)((long)kinmem + 0x74) = 1;
                        *(undefined4 *)((long)kinmem + 100) = 0;
                        goto LAB_0010a7c1;
                      }
                      *(undefined4 *)((long)kinmem + 100) = 0;
                      if (1.5 < *(double *)((long)kinmem + 200)) goto LAB_0010a7c1;
                      while( true ) {
                        N_VScale(0xbff0000000000000,uVar3,uVar3);
                        x = (N_Vector)((long)kinmem + 0x268);
                        pKVar11 = (KINMem)kinmem;
                        iVar6 = (**(code **)((long)kinmem + 0x230))
                                          (kinmem,uVar17,uVar3,(N_Vector)((long)kinmem + 0x268),
                                           (long)kinmem + 0x260);
                        if (iVar6 == 0) break;
                        p_Var15 = (N_Vector)0xfffffff3;
                        pcVar10 = extraout_RDX_06;
                        if (((iVar6 < 0) || (*(long *)((long)kinmem + 0x228) == 0)) ||
                           (*(int *)((long)kinmem + 100) != 0)) goto LAB_0010bc8b;
                        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
LAB_0010a7c1:
                        if (*(code **)((long)kinmem + 0x228) != (code *)0x0) {
                          pKVar11 = (KINMem)kinmem;
                          iVar6 = (**(code **)((long)kinmem + 0x228))();
                          *(undefined4 *)((long)kinmem + 100) = 1;
                          x = *(N_Vector *)((long)kinmem + 0xd0);
                          *(N_Vector *)((long)kinmem + 0xe0) = x;
                          *(N_Vector *)((long)kinmem + 0xe8) = x;
                          pcVar10 = extraout_RDX_05;
                          if (iVar6 != 0) goto LAB_0010bc3b;
                        }
                      }
                      N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,uVar2,uVar17,uVar17);
                      if (*(long *)((long)kinmem + 0x1c0) == 0) {
LAB_0010a8e4:
                        if (*(int *)((long)kinmem + 0x164) == 0) {
                          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x120),
                                   *(undefined8 *)((long)kinmem + 0x110));
                        }
                        else {
                          N_VLinearSum(1.0 - *(double *)((long)kinmem + 0x168),
                                       *(undefined8 *)((long)kinmem + 0x108),
                                       *(undefined8 *)((long)kinmem + 0x120),
                                       *(undefined8 *)((long)kinmem + 0x110));
                        }
                      }
                      else {
                        uVar14 = *(ulong *)((long)kinmem + 0x1c8);
                        if (*(long *)((long)kinmem + 0xd0) <= (long)uVar14) goto LAB_0010a8e4;
                        if ((long)uVar14 < 1) {
                          uVar14 = 0;
                        }
                        x = *(N_Vector *)((long)kinmem + 0x110);
                        R = *(sunrealtype **)((long)kinmem + 0x1a8);
                        AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x120),p_Var1,x,
                                    *(N_Vector *)((long)kinmem + 0x108),
                                    *(long *)((long)kinmem + 0xd0) + ~uVar14,R,
                                    *(sunrealtype **)((long)kinmem + 0x1a0));
                      }
                      pKVar11 = *(KINMem *)((long)kinmem + 0x110);
                      iVar6 = (**(code **)((long)kinmem + 0x10))
                                        (pKVar11,*(undefined8 *)((long)kinmem + 0x118),
                                         *(undefined8 *)((long)kinmem + 0x18));
                      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                      pcVar10 = extraout_RDX_07;
                      if (iVar6 < 0) {
LAB_0010bc3b:
                        p_Var15 = (N_Vector)0xfffffff3;
                        goto LAB_0010bc8b;
                      }
                      N_VProd(*(undefined8 *)((long)kinmem + 0x130),
                              *(undefined8 *)((long)kinmem + 0x118),
                              *(undefined8 *)((long)kinmem + 0x148));
                      pKVar11 = *(KINMem *)((long)kinmem + 0x148);
                      uVar17 = N_VMaxNorm();
                      *(undefined8 *)((long)kinmem + 0x250) = uVar17;
                      KINPrintInfo(pKVar11,4,module_04,(char *)x,
                                   "scaled f norm (for stopping) = %12.3lg");
                      R = *(sunrealtype **)((long)kinmem + 0xd8);
                      KINPrintInfo(pKVar11,2,module_05,(char *)x,
                                   "nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
                                   *(undefined8 *)((long)kinmem + 0x250),
                                   *(undefined8 *)((long)kinmem + 0xd0),R);
                      lVar8 = *(long *)((long)kinmem + 0xd0);
                      lVar4 = *(long *)((long)kinmem + 0x38);
                      dVar23 = *(double *)((long)kinmem + 0x250);
                      dVar19 = *(double *)((long)kinmem + 0x20);
                      pKVar11 = *(KINMem *)((long)kinmem + 0x110);
                      N_VScale(0x3ff0000000000000,pKVar11,*(undefined8 *)((long)kinmem + 0x108));
                      if ((dVar23 <= dVar19) || (lVar4 <= lVar8)) {
                        x = (N_Vector)0xfffffffa;
                        if (lVar8 < lVar4) {
                          x = (N_Vector)0xfffffc19;
                        }
                        pcVar10 = extraout_RDX_08;
                        p_Var15 = (N_Vector)0x0;
                        if (dVar19 < dVar23) {
                          p_Var15 = x;
                        }
LAB_0010bc8b:
                        KINPrintInfo(pKVar11,1,pcVar10,(char *)x,"Return value: %d",p_Var15,R);
                        return (int)p_Var15;
                      }
                      if (*(int *)((long)kinmem + 0x68) != 0) {
                        sVar18 = (sunrealtype)
                                 N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                            *(undefined8 *)((long)kinmem + 0x130));
                        KINForcingTerm((KINMem)kinmem,sVar18);
                      }
                      lVar8 = *(long *)((long)kinmem + 0xd0);
                      iVar6 = *(int *)((long)kinmem + 0x240);
                    } while( true );
                  }
                  lVar8 = N_VClone(*(undefined8 *)((long)kinmem + 0x110));
                  *(long *)((long)kinmem + 0x120) = lVar8;
                  if (lVar8 != 0) {
                    *(long *)((long)kinmem + 0x210) =
                         *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
                    *(long *)((long)kinmem + 0x218) =
                         *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
                    iVar6 = *(int *)((long)kinmem + 0x240);
                    goto LAB_0010a6d8;
                  }
                  pcVar10 = "KINSol";
                  pcVar12 = "A memory request failed.";
                  uVar9 = 0xfffffffc;
                  iVar7 = -4;
                  iVar6 = 0x25d;
                }
                else {
                  pcVar10 = "KINSolInit";
                  pcVar12 = "The linear solver\'s init routine failed.";
                  uVar9 = 0xfffffff6;
                  iVar7 = -10;
                  iVar6 = 0x646;
                }
              }
              else {
                pcVar10 = "KINSolInit";
                pcVar12 = "The system function failed at the first call.";
                uVar9 = 0xfffffff2;
                iVar7 = -0xe;
                iVar6 = 0x62f;
              }
            }
            else if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) {
              pcVar10 = "KINSolInit";
              pcVar12 = "Constraints not allowed with fixed point or Picard iterations";
              uVar9 = 0xfffffffe;
              iVar7 = -2;
              iVar6 = 0x5ce;
            }
            else {
              *(undefined4 *)((long)kinmem + 0x60) = 1;
              if ((*(long *)((long)pKVar11->kin_uround + 0xe0) == 0) ||
                 (*(long *)((long)pKVar11->kin_uround + 0xe8) == 0)) {
                pcVar10 = "KINSolInit";
                pcVar12 = "A required vector operation is not implemented.";
                uVar9 = 0xfffffffe;
                iVar7 = -2;
                iVar6 = 0x5df;
              }
              else {
                iVar6 = N_VConstrMask(pKVar11,*(undefined8 *)((long)kinmem + 0x108),
                                      *(undefined8 *)((long)kinmem + 0x148));
                pcVar10 = extraout_RDX_04;
                if (iVar6 != 0) goto LAB_0010a334;
                pcVar10 = "KINSolInit";
                pcVar12 = "Initial guess does NOT meet constraints.";
                uVar9 = 0xfffffffe;
                iVar7 = -2;
                iVar6 = 0x5ec;
              }
            }
          }
        }
      }
    }
    else {
      pcVar10 = "KINSolInit";
      pcVar12 = "Illegal value for global strategy.";
      uVar9 = 0xfffffffe;
      iVar7 = -2;
      iVar6 = 0x5a9;
    }
  }
  goto LAB_0010a311;
  while( true ) {
    iVar6 = iVar6 + 1;
    pKVar11 = *(KINMem *)((long)kinmem + 0x118);
    local_e8 = (double)N_VWL2Norm(pKVar11,*(undefined8 *)((long)kinmem + 0x130));
    dVar25 = local_e8 * 0.5 * local_e8;
    local_c8._8_8_ = extraout_XMM0_Qb_00;
    local_c8._0_8_ = dVar25;
    dVar29 = *(double *)((long)kinmem + 600);
    dVar21 = dVar22 * local_d8 + dVar29;
    KINPrintInfo(pKVar11,10,module_10,pcVar10,
                 "f1norm = %15.8le   beta_cond = %15.8le   lam = %15.8le",dVar25);
    bVar16 = dVar20 * local_d8 + dVar29 <= dVar25;
    if ((dVar21 < dVar25 || bVar16) || (local_e0 <= local_a8)) break;
LAB_0010b44f:
    local_98 = local_a8;
    local_a8 = local_a8 + local_a8;
    local_d8 = local_a8;
    if (local_e0 <= local_a8) {
      local_d8 = local_e0;
    }
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                 *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
    pKVar11 = *(KINMem *)((long)kinmem + 0x110);
    iVar7 = (**(code **)((long)kinmem + 0x10))
                      (pKVar11,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x18));
    *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
    pcVar12 = extraout_RDX_23;
    if (iVar7 != 0) goto LAB_0010bbaf;
  }
  pcVar12 = extraout_RDX_24;
  if (dVar21 >= dVar25 && !bVar16) {
    local_d8 = local_e0;
  }
LAB_0010b59a:
  if ((local_d8 < 1.0) || ((1.0 < local_d8 && (dVar21 < dVar25)))) {
    uVar26 = SUB84(local_d8,0);
    uVar27 = (undefined4)((ulong)local_d8 >> 0x20);
    if (local_98 <= local_d8) {
      uVar26 = SUB84(local_98,0);
      uVar27 = (undefined4)((ulong)local_98 >> 0x20);
    }
    local_a8 = (double)CONCAT44(uVar27,uVar26);
    local_98 = ABS(local_98 - local_d8);
    do {
      local_e0 = local_98;
      local_98 = local_e0;
      do {
        local_e0 = local_98;
        local_98 = local_e0 * 0.5;
        local_d8 = local_a8 + local_98;
        N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                     *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
        pKVar11 = *(KINMem *)((long)kinmem + 0x110);
        iVar7 = (**(code **)((long)kinmem + 0x10))
                          (pKVar11,*(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x18));
        *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
        pcVar12 = extraout_RDX_25;
        if (iVar7 != 0) goto LAB_0010bbaf;
        iVar6 = iVar6 + 1;
        pKVar11 = *(KINMem *)((long)kinmem + 0x118);
        local_e8 = (double)N_VWL2Norm(pKVar11,*(undefined8 *)((long)kinmem + 0x130));
        dVar25 = local_e8 * 0.5 * local_e8;
        local_c8._0_8_ = dVar25;
        dVar29 = dVar22 * local_d8 + *(double *)((long)kinmem + 600);
        dVar21 = dVar20 * local_d8 + *(double *)((long)kinmem + 600);
        KINPrintInfo(pKVar11,0xb,module_11,pcVar10,
                     "f1norm = %15.8le  alpha_cond = %15.8le  beta_cond = %15.8le  lam = %15.8le",
                     dVar25,dVar29);
      } while (dVar29 < dVar25);
      if (dVar21 <= dVar25) break;
      local_98 = local_e0 - local_98;
      local_a8 = (double)(~-(ulong)(dVar25 < dVar21) & (ulong)local_a8 |
                         -(ulong)(dVar25 < dVar21) & (ulong)local_d8);
    } while (dVar19 <= local_98);
    pcVar12 = extraout_RDX_26;
    if (dVar25 < dVar21) {
      N_VLinearSum(0x3ff0000000000000,local_d8,*(undefined8 *)((long)kinmem + 0x108),
                   *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
      pKVar11 = *(KINMem *)((long)kinmem + 0x110);
      iVar7 = (**(code **)((long)kinmem + 0x10))
                        (pKVar11,*(undefined8 *)((long)kinmem + 0x118),
                         *(undefined8 *)((long)kinmem + 0x18));
      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
      pcVar12 = extraout_RDX_27;
      if (iVar7 != 0) {
LAB_0010bbaf:
        KINPrintInfo(pKVar11,1,pcVar12,pcVar10,"Return value: %d",0xfffffff3);
        goto switchD_0010bcda_caseD_fffffff3;
      }
      pKVar11 = *(KINMem *)((long)kinmem + 0x118);
      local_e8 = (double)N_VWL2Norm(pKVar11,*(undefined8 *)((long)kinmem + 0x130));
      local_c8._0_8_ = local_e8 * 0.5 * local_e8;
      *(long *)((long)kinmem + 0xf0) = *(long *)((long)kinmem + 0xf0) + 1;
      pcVar12 = extraout_RDX_28;
    }
  }
  else {
LAB_0010b810:
    local_c8._0_8_ = dVar25;
  }
LAB_0010b82c:
  *(long *)((long)kinmem + 0xf8) = *(long *)((long)kinmem + 0xf8) + (long)iVar6;
  iVar6 = 0;
  KINPrintInfo(pKVar11,0xc,pcVar12,pcVar10,"no. of lambda adjustments = %ld");
  *(double *)((long)kinmem + 0x260) = local_b8 * local_d8 * *(double *)((long)kinmem + 0x260);
  *(double *)((long)kinmem + 0x268) = local_b8 * local_d8 * *(double *)((long)kinmem + 0x268);
  pcVar12 = extraout_RDX_29;
  if (local_f0 * local_d8 <= *(double *)((long)kinmem + 0x78) * 0.99) {
LAB_0010b348:
    bVar16 = false;
  }
  else {
    bVar16 = true;
  }
  if (*(long *)((long)kinmem + 0x50) < *(long *)((long)kinmem + 0xf0)) {
    KINPrintInfo(pKVar11,1,pcVar12,pcVar10,"Return value: %d",0xfffffff8);
    goto switchD_0010bcda_caseD_fffffff8;
  }
LAB_0010b35c:
  uVar13 = 0;
LAB_0010b367:
  uVar9 = uVar13;
  if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) goto LAB_0010b9db;
  if (*(int *)((long)kinmem + 0x68) != 0) {
    KINForcingTerm((KINMem)kinmem,local_e8);
  }
  *(double *)((long)kinmem + 0x250) = local_e8;
  if (iVar6 == -0x3e5) {
    if ((*(long *)((long)kinmem + 0x228) == 0) || (*(int *)((long)kinmem + 100) != 0))
    goto LAB_0010b8a4;
    *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
    *(undefined4 *)((long)kinmem + 0x70) = 1;
    uVar13 = 0xfffffc1a;
    goto LAB_0010aade;
  }
  N_VProd(*(undefined8 *)((long)kinmem + 0x130),*(undefined8 *)((long)kinmem + 0x118),
          *(undefined8 *)((long)kinmem + 0x148));
  pKVar11 = *(KINMem *)((long)kinmem + 0x148);
  dVar19 = (double)N_VMaxNorm();
  KINPrintInfo(pKVar11,4,module_12,pcVar10,"scaled f norm (for stopping) = %12.3lg");
  uVar9 = 0;
  if (dVar19 <= *(double *)((long)kinmem + 0x20)) goto LAB_0010b9db;
  p_Var1 = *(N_Vector *)((long)kinmem + 0x138);
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
               *(undefined8 *)((long)kinmem + 0x108),p_Var1);
  sVar18 = KINScSNorm((KINMem)kinmem,p_Var1,*(N_Vector *)((long)kinmem + 0x110));
  if (sVar18 <= *(double *)((long)kinmem + 0x28)) {
    uVar9 = 2;
    if ((*(long *)((long)kinmem + 0x228) == 0) || (*(int *)((long)kinmem + 100) != 0))
    goto LAB_0010b9db;
    *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
  }
  else {
    lVar8 = *(long *)((long)kinmem + 0xd0);
    uVar9 = 0xfffffffa;
    if (*(long *)((long)kinmem + 0x38) <= lVar8) goto LAB_0010b9db;
    if (bVar16) {
      pcVar10 = (char *)(*(long *)((long)kinmem + 0x100) + 1);
      *(char **)((long)kinmem + 0x100) = pcVar10;
      uVar9 = 0xfffffff9;
      if (pcVar10 == (char *)0x5) goto LAB_0010b9db;
    }
    else {
      *(undefined8 *)((long)kinmem + 0x100) = 0;
    }
    if (*(int *)((long)kinmem + 0x240) == 0) {
      uVar9 = 0xfffffc19;
      if (*(int *)((long)kinmem + 0x6c) != 0) goto LAB_0010b9db;
      pcVar10 = (char *)(lVar8 - *(long *)((long)kinmem + 0xe8));
      if ((long)pcVar10 < *(long *)((long)kinmem + 0x48)) {
        if (*(int *)((long)kinmem + 0x70) == 0) {
          if (*(int *)((long)kinmem + 0x74) == 0) goto LAB_0010bba3;
          *(undefined8 *)((long)kinmem + 0x270) = *(undefined8 *)((long)kinmem + 0x250);
        }
        else {
          *(undefined8 *)((long)kinmem + 0x270) = *(undefined8 *)((long)kinmem + 0x250);
          if (*(int *)((long)kinmem + 0x74) == 0) goto LAB_0010bba3;
        }
        *(undefined4 *)((long)kinmem + 0x74) = 0;
      }
      else {
        *(long *)((long)kinmem + 0xe8) = lVar8;
        if (*(int *)((long)kinmem + 0x278) == 0) {
          dVar19 = *(double *)((long)kinmem + 0x280);
        }
        else {
          dVar19 = *(double *)((long)kinmem + 0x250) / *(double *)((long)kinmem + 0x20) + -1.0;
          dVar29 = 0.0;
          if (0.0 <= dVar19) {
            dVar29 = dVar19;
          }
          if (dVar29 <= 12.0) {
            dVar20 = *(double *)((long)kinmem + 0x288);
            dVar22 = exp(dVar29);
            dVar19 = *(double *)((long)kinmem + 0x290);
            if (dVar22 * dVar20 < dVar19) {
              dVar20 = *(double *)((long)kinmem + 0x288);
              dVar19 = exp(dVar29);
              dVar19 = dVar19 * dVar20;
            }
          }
          else {
            dVar19 = *(double *)((long)kinmem + 0x290);
          }
          *(double *)((long)kinmem + 0x280) = dVar19;
        }
        if (dVar19 * *(double *)((long)kinmem + 0x270) < *(double *)((long)kinmem + 0x250)) {
          if ((*(long *)((long)kinmem + 0x228) != 0) && (*(int *)((long)kinmem + 100) == 0)) {
            *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
          }
          goto LAB_0010b9db;
        }
        *(double *)((long)kinmem + 0x270) = *(double *)((long)kinmem + 0x250);
      }
LAB_0010bba3:
      *(undefined8 *)((long)kinmem + 200) = 0x3ff0000000000000;
      goto LAB_0010b9db;
    }
    *(sunrealtype *)((long)kinmem + 200) = sVar18;
  }
  uVar9 = 0xfffffc19;
  goto LAB_0010b9db;
LAB_0010bbf5:
  KINPrintInfo(pKVar11,1,pcVar12,pcVar10,"Return value: %d",0xfffffff1);
  goto switchD_0010bcda_caseD_fffffff1;
LAB_0010b8a4:
  uVar9 = 0xfffffffb;
  if (*(int *)((long)kinmem + 0x30) == 0) {
    uVar9 = 2;
  }
LAB_0010b9db:
  pKVar11 = *(KINMem *)((long)kinmem + 0x110);
  N_VScale(0x3ff0000000000000,pKVar11,*(undefined8 *)((long)kinmem + 0x108));
  *(undefined8 *)((long)kinmem + 600) = local_c8._0_8_;
  R = *(sunrealtype **)((long)kinmem + 0xd8);
  KINPrintInfo(pKVar11,2,module_13,pcVar10,"nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
               *(undefined8 *)((long)kinmem + 0x250),*(undefined8 *)((long)kinmem + 0xd0),R);
  uVar13 = 0xfffffc19;
  pcVar12 = extraout_RDX_30;
  if (uVar9 != 0xfffffc19) goto LAB_0010bca9;
  goto LAB_0010aa8f;
LAB_0010bca9:
  KINPrintInfo(pKVar11,1,pcVar12,pcVar10,"Return value: %d",(ulong)uVar9,R);
  switch(uVar9) {
  case 0xfffffff1:
switchD_0010bcda_caseD_fffffff1:
    pcVar10 = "KINSol";
    pcVar12 = "Unable to correct repeated recoverable system function errors.";
    uVar9 = 0xfffffff1;
    iVar7 = -0xf;
    iVar6 = 0x2db;
    break;
  default:
    goto switchD_0010bcda_caseD_fffffff2;
  case 0xfffffff3:
switchD_0010bcda_caseD_fffffff3:
    pcVar10 = "KINSol";
    pcVar12 = "The system function failed in an unrecoverable manner.";
    uVar9 = 0xfffffff3;
    iVar7 = -0xd;
    iVar6 = 0x2d7;
    break;
  case 0xfffffff4:
    pcVar10 = "KINSol";
    pcVar12 = "The linear solver\'s solve function failed in an unrecoverable manner.";
    uVar9 = 0xfffffff4;
    iVar7 = -0xc;
    iVar6 = 0x2e3;
    break;
  case 0xfffffff5:
    pcVar10 = "KINSol";
    pcVar12 = "The linear solver\'s setup function failed in an unrecoverable manner.";
    uVar9 = 0xfffffff5;
    iVar7 = -0xb;
    iVar6 = 0x2df;
    break;
  case 0xfffffff7:
    pcVar10 = "KINSol";
    pcVar12 = 
    "The linear solver\'s solve function failed recoverably, but the Jacobian data is already current."
    ;
    uVar9 = 0xfffffff7;
    iVar7 = -9;
    iVar6 = 0x2e7;
    break;
  case 0xfffffff8:
switchD_0010bcda_caseD_fffffff8:
    pcVar10 = "KINSol";
    pcVar12 = 
    "The line search algorithm was unable to satisfy the beta-condition for nbcfails iterations.";
    uVar9 = 0xfffffff8;
    iVar7 = -8;
    iVar6 = 0x2ef;
    break;
  case 0xfffffff9:
    pcVar10 = "KINSol";
    pcVar12 = "Five consecutive steps have been taken that satisfy a scaled step length test.";
    uVar9 = 0xfffffff9;
    iVar7 = -7;
    iVar6 = 0x2f7;
    break;
  case 0xfffffffa:
    pcVar10 = "KINSol";
    pcVar12 = "The maximum number of iterations was reached before convergence.";
    uVar9 = 0xfffffffa;
    iVar7 = -6;
    iVar6 = 0x2f3;
    break;
  case 0xfffffffb:
    pcVar10 = "KINSol";
    pcVar12 = 
    "The line search algorithm was unable to find an iterate sufficiently distinct from the current iterate."
    ;
    uVar9 = 0xfffffffb;
    iVar7 = -5;
    iVar6 = 0x2eb;
  }
LAB_0010a311:
  KINProcessError((KINMem)kinmem,iVar7,iVar6,pcVar10,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                  ,pcVar12);
switchD_0010bcda_caseD_fffffff2:
  return uVar9;
}

Assistant:

int KINSol(void* kinmem, N_Vector u, int strategy_in, N_Vector u_scale,
           N_Vector f_scale)
{
  sunrealtype fnormp, f1normp, epsmin;
  KINMem kin_mem;
  int ret, sflag;
  sunbooleantype maxStepTaken;

  /* intialize to avoid compiler warning messages */

  maxStepTaken = SUNFALSE;
  f1normp = fnormp = -ONE;

  /* initialize epsmin to avoid compiler warning message */

  epsmin = ZERO;

  /* check for kinmem non-NULL */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (kin_mem->kin_MallocDone == SUNFALSE)
  {
    KINProcessError(kin_mem, KIN_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_NO_MALLOC);
  }

  /* load input arguments */

  kin_mem->kin_uu             = u;
  kin_mem->kin_uscale         = u_scale;
  kin_mem->kin_fscale         = f_scale;
  kin_mem->kin_globalstrategy = strategy_in;

  /* CSW:
     Call fixed point solver if requested.  Note that this should probably
     be forked off to a FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_FP)
  {
    if (kin_mem->kin_uu == NULL)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_UU_NULL);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

    if (kin_mem->kin_constraintsSet != SUNFALSE)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_CONSTRAINTS_NOTOK);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_TOL, "KINSOL", "KINSol", INFO_TOL,
                 kin_mem->kin_scsteptol, kin_mem->kin_fnormtol);
#endif

    kin_mem->kin_nfe = kin_mem->kin_nnilset = kin_mem->kin_nnilset_sub =
      kin_mem->kin_nni = kin_mem->kin_nbcf = kin_mem->kin_nbktrk = 0;
    ret = KINFP(kin_mem);

    switch (ret)
    {
    case KIN_SYSFUNC_FAIL:
      KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_SYSFUNC_FAILED);
      break;
    case KIN_MAXITER_REACHED:
      KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__,
                      __FILE__, MSG_MAXITER_REACHED);
      break;
    }

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  /* initialize solver */
  ret = KINSolInit(kin_mem);
  if (ret != KIN_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  kin_mem->kin_ncscmx = 0;

  /* Note: The following logic allows the choice of whether or not
     to force a call to the linear solver setup upon a given call to
     KINSol */

  if (kin_mem->kin_noInitSetup) { kin_mem->kin_sthrsh = ONE; }
  else { kin_mem->kin_sthrsh = TWO; }

  /* if eps is to be bounded from below, set the bound */

  if (kin_mem->kin_inexact_ls && !(kin_mem->kin_noMinEps))
  {
    epsmin = POINT01 * kin_mem->kin_fnormtol;
  }

  /* if omega is zero at this point, make sure it will be evaluated
     at each iteration based on the provided min/max bounds and the
     current function norm. */
  if (kin_mem->kin_omega == ZERO) { kin_mem->kin_eval_omega = SUNTRUE; }
  else { kin_mem->kin_eval_omega = SUNFALSE; }

  /* CSW:
     Call fixed point solver for Picard method if requested.
     Note that this should probably be forked off to a part of an
     FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_PICARD)
  {
    if (kin_mem->kin_gval == NULL)
    {
      kin_mem->kin_gval = N_VClone(kin_mem->kin_unew);
      if (kin_mem->kin_gval == NULL)
      {
        KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
        return (KIN_MEM_FAIL);
      }
      kin_mem->kin_liw += kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_lrw1;
    }
    ret = KINPicardAA(kin_mem);

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  for (;;)
  {
    kin_mem->kin_retry_nni = SUNFALSE;

    kin_mem->kin_nni++;

    /* calculate the epsilon (stopping criteria for iterative linear solver)
       for this iteration based on eta from the routine KINForcingTerm */

    if (kin_mem->kin_inexact_ls)
    {
      kin_mem->kin_eps = (kin_mem->kin_eta + kin_mem->kin_uround) *
                         kin_mem->kin_fnorm;
      if (!(kin_mem->kin_noMinEps))
      {
        kin_mem->kin_eps = SUNMAX(epsmin, kin_mem->kin_eps);
      }
    }

  repeat_nni:

    /* call the appropriate routine to calculate an acceptable step pp */

    sflag = 0;

    if (kin_mem->kin_globalstrategy == KIN_NONE)
    {
      /* Full Newton Step*/

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINFullNewton(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }
    }
    else if (kin_mem->kin_globalstrategy == KIN_LINESEARCH)
    {
      /* Line Search */

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINLineSearch(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }

      /* if too many beta condition failures, then stop iteration */
      if (kin_mem->kin_nbcf > kin_mem->kin_mxnbcf)
      {
        ret = KIN_LINESEARCH_BCFAIL;
        break;
      }
    }

    if ((kin_mem->kin_globalstrategy != KIN_PICARD) &&
        (kin_mem->kin_globalstrategy != KIN_FP))
    {
      /* evaluate eta by calling the forcing term routine */
      if (kin_mem->kin_callForcingTerm) { KINForcingTerm(kin_mem, fnormp); }

      kin_mem->kin_fnorm = fnormp;

      /* call KINStop to check if tolerances where met by this iteration */
      ret = KINStop(kin_mem, maxStepTaken, sflag);

      if (ret == RETRY_ITERATION)
      {
        kin_mem->kin_retry_nni = SUNTRUE;
        goto repeat_nni;
      }
    }

    /* update uu after the iteration */
    N_VScale(ONE, kin_mem->kin_unew, kin_mem->kin_uu);

    kin_mem->kin_f1norm = f1normp;

    /* print the current nni, fnorm, and nfe values */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_NNI, "KINSOL", "KINSol", INFO_NNI,
                 kin_mem->kin_nni, kin_mem->kin_nfe, kin_mem->kin_fnorm);
#endif

    if (ret != CONTINUE_ITERATIONS) { break; }

  } /* end of loop; return */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
  KINPrintInfo(kin_mem, PRNT_RETVAL, "KINSOL", "KINSol", INFO_RETVAL, ret);
#endif

  switch (ret)
  {
  case KIN_SYSFUNC_FAIL:
    KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SYSFUNC_FAILED);
    break;
  case KIN_REPTD_SYSFUNC_ERR:
    KINProcessError(kin_mem, KIN_REPTD_SYSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_SYSFUNC_REPTD);
    break;
  case KIN_LSETUP_FAIL:
    KINProcessError(kin_mem, KIN_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSETUP_FAILED);
    break;
  case KIN_LSOLVE_FAIL:
    KINProcessError(kin_mem, KIN_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSOLVE_FAILED);
    break;
  case KIN_LINSOLV_NO_RECOVERY:
    KINProcessError(kin_mem, KIN_LINSOLV_NO_RECOVERY, __LINE__, __func__,
                    __FILE__, MSG_LINSOLV_NO_RECOVERY);
    break;
  case KIN_LINESEARCH_NONCONV:
    KINProcessError(kin_mem, KIN_LINESEARCH_NONCONV, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_NONCONV);
    break;
  case KIN_LINESEARCH_BCFAIL:
    KINProcessError(kin_mem, KIN_LINESEARCH_BCFAIL, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_BCFAIL);
    break;
  case KIN_MAXITER_REACHED:
    KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__, __FILE__,
                    MSG_MAXITER_REACHED);
    break;
  case KIN_MXNEWT_5X_EXCEEDED:
    KINProcessError(kin_mem, KIN_MXNEWT_5X_EXCEEDED, __LINE__, __func__,
                    __FILE__, MSG_MXNEWT_5X_EXCEEDED);
    break;
  }

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (ret);
}